

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

bool GetUniquePathFromEnv(char *env_name,char *path)

{
  byte bVar1;
  bool bVar2;
  __pid_t _Var3;
  byte *pbVar4;
  char *pcVar5;
  char *pcVar6;
  _Head_base<2UL,_const_char_*,_false> _Var7;
  undefined1 local_168 [8];
  char forceVarName [256];
  char **local_60;
  char **local_58;
  long local_50;
  char *local_48;
  char *append1;
  char *append2;
  bool pidIsForced;
  
  pbVar4 = (byte *)getenv(env_name);
  if ((pbVar4 == (byte *)0x0) || (*pbVar4 == 0)) {
    return false;
  }
  _Var7._M_head_impl = "";
  local_48 = "";
  append1 = "";
  pcVar5 = getenv("PMIX_RANK");
  if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
    pcVar5 = getenv("SLURM_JOB_ID");
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      pcVar5 = getenv("OMPI_HOME");
      if ((pcVar5 == (char *)0x0) || (forceVarName[8] = '\x01', *pcVar5 == '\0')) {
        pcVar5 = getenv("PMI_RANK");
        if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) goto LAB_001209d1;
        forceVarName[8] = '\0';
      }
    }
    else {
      pcVar5 = getenv("SLURM_PROCID");
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
        pcVar6 = ".slurmid-";
        goto LAB_001209d8;
      }
      forceVarName[8] = '\x01';
    }
    pcVar6 = "";
  }
  else {
LAB_001209d1:
    pcVar6 = ".rank-";
LAB_001209d8:
    forceVarName[8] = '\0';
    _Var7._M_head_impl = pcVar5;
  }
  local_60 = &append1;
  local_58 = &local_48;
  local_50 = (long)&append2 + 7;
  local_168 = (undefined1  [8])_Var7._M_head_impl;
  forceVarName._0_8_ = pcVar6;
  std::tuple<bool&,char_const*&,char_const*&>::operator=
            ((tuple<bool&,char_const*&,char_const*&> *)&local_60,
             (tuple<bool,_const_char_*,_const_char_*> *)local_168);
  snprintf(local_168,0x100,"%s_USE_PID",env_name);
  bVar2 = true;
  if (append2._7_1_ == '\0') {
    pcVar5 = getenv(local_168);
    bVar2 = tcmalloc::commandlineflags::StringToBool(pcVar5,false);
  }
  pcVar6 = append1;
  pcVar5 = local_48;
  bVar1 = *pbVar4;
  *pbVar4 = bVar1 & 0x7f;
  append2._7_1_ = bVar2;
  if ((char)bVar1 < '\0' || bVar2 != false) {
    _Var3 = getpid();
    snprintf(path,0x1000,"%s%s%s_%d",pbVar4,pcVar5,pcVar6,_Var3);
    if ((char)bVar1 < '\0') goto LAB_00120b32;
  }
  else {
    snprintf(path,0x1000,"%s%s%s",pbVar4,local_48,append1);
  }
  if (append2._7_1_ != '\0') {
    return true;
  }
LAB_00120b32:
  *pbVar4 = *pbVar4 | 0x80;
  return true;
}

Assistant:

bool GetUniquePathFromEnv(const char* env_name, char* path) {
  char* envval = getenv(env_name);

  if (envval == nullptr || *envval == '\0') {
    return false;
  }

  const char* append1 = "";
  const char* append2 = "";
  bool pidIsForced;
  std::tie(pidIsForced, append1, append2) = QueryHPCEnvironment();

  // Generate the "forcing" environment variable name in a form of
  // <ORIG_ENVAR>_USE_PID that requests PID to be used in the file names
  char forceVarName[256];
  snprintf(forceVarName, sizeof(forceVarName), "%s_USE_PID", env_name);

  pidIsForced = pidIsForced || EnvToBool(forceVarName, false);

  // Get information about the child bit and drop it
  const bool childBitDetected = (*envval & 128) != 0;
  *envval &= ~128;

  if (pidIsForced || childBitDetected) {
    snprintf(path, PATH_MAX, "%s%s%s_%d",
             envval, append1, append2, GetPID());
  } else {
    snprintf(path, PATH_MAX, "%s%s%s", envval, append1, append2);
  }

  // Set the child bit for the fork'd processes, unless appending pid
  // was forced by either _USE_PID thingy or via MPI detection stuff.
  if (childBitDetected || !pidIsForced) {
    *envval |= 128;
  }
  return true;
}